

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

void __thiscall gl4cts::GLSL420Pack::InitializerListTest::logTestCaseName(InitializerListTest *this)

{
  ostringstream *this_00;
  int iVar1;
  pointer ptVar2;
  TestError *this_01;
  long lVar3;
  char *pcVar4;
  MessageBuilder message;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  iVar1 = this->m_current_test_case_index;
  ptVar2 = (this->m_test_cases).
           super__Vector_base<gl4cts::GLSL420Pack::InitializerListTest::testCase,_std::allocator<gl4cts::GLSL420Pack::InitializerListTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_198._0_8_ =
       ((this->super_GLSLTestBase).super_TestBase.super_TestCase.m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  switch(ptVar2[iVar1].m_initializer) {
  case VECTOR:
    lVar3 = 0x10;
    pcVar4 = "List. Single vec";
    goto LAB_009e8030;
  case MATRIX:
    lVar3 = 0x10;
    pcVar4 = "List. Single mat";
    goto LAB_009e8010;
  case MATRIX_ROWS:
    lVar3 = 0xf;
    pcVar4 = "Ctr. Single mat";
    goto LAB_009e8010;
  case STRUCT:
    lVar3 = 0xf;
    pcVar4 = "List. Structure";
    break;
  case ARRAY_SCALAR:
    lVar3 = 0x16;
    pcVar4 = "List. Array of scalars";
    break;
  case ARRAY_VECTOR_CTR:
    lVar3 = 0x11;
    pcVar4 = "Ctr. Array of vec";
    goto LAB_009e8030;
  case ARRAY_VECTOR_LIST:
    lVar3 = 0x12;
    pcVar4 = "List. Array of vec";
    goto LAB_009e8030;
  case ARRAY_MATRIX_CTR:
    lVar3 = 0x11;
    pcVar4 = "Ctr. Array of mat";
    goto LAB_009e8010;
  case ARRAY_MATRIX_LIST:
    lVar3 = 0x12;
    pcVar4 = "List. Array of mat";
    goto LAB_009e8010;
  case ARRAY_STRUCT:
    lVar3 = 0x19;
    pcVar4 = "List. Array of structures";
    break;
  case NESTED_STRUCT_CTR:
    lVar3 = 0x15;
    pcVar4 = "Ctr. Nested structure";
    break;
  case NESTED_STRUCT_LIST:
    lVar3 = 0x16;
    pcVar4 = "List. Nested structure";
    break;
  case NESTED_STURCT_ARRAYS_STRUCT_LIST:
    lVar3 = 0x24;
    pcVar4 = "List. Structure with structure array";
    break;
  case NESTED_STURCT_ARRAYS_STRUCT_MIX:
    lVar3 = 0x23;
    pcVar4 = "Mix. Structure with structure array";
    break;
  case NESTED_ARRAY_STRUCT_STRUCT_LIST:
    lVar3 = 0x29;
    pcVar4 = "List. Array of structures with structures";
    break;
  case NESTED_ARRAY_STRUCT_STRUCT_MIX:
    lVar3 = 0x28;
    pcVar4 = "Mix. Array of structures with structures";
    break;
  case NESTED_STRUCT_STRUCT_ARRAY_LIST:
    lVar3 = 0x29;
    pcVar4 = "List. Structure with structure with array";
    break;
  case NESTED_STRUCT_STRUCT_ARRAY_MIX:
    lVar3 = 0x28;
    pcVar4 = "Mix. Structure with structure with array";
    break;
  case UNSIZED_ARRAY_SCALAR:
    lVar3 = 0x1e;
    pcVar4 = "List. Unsized array of scalars";
    break;
  case UNSIZED_ARRAY_VECTOR:
    lVar3 = 0x1a;
    pcVar4 = "List. Unsized array of vec";
    goto LAB_009e8030;
  case UNSIZED_ARRAY_MATRIX:
    lVar3 = 0x1a;
    pcVar4 = "List. Unsized array of mat";
LAB_009e8010:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar4,lVar3);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    lVar3 = 1;
    pcVar4 = "x";
LAB_009e8030:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar4,lVar3);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    goto LAB_009e8044;
  case UNSIZED_ARRAY_STRUCT:
    lVar3 = 0x21;
    pcVar4 = "List. Unsized array of structures";
    break;
  default:
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x3776);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar4,lVar3);
LAB_009e8044:
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void InitializerListTest::logTestCaseName()
{
	const testCase& test_case = m_test_cases[m_current_test_case_index];

	tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

	switch (test_case.m_initializer)
	{
	case VECTOR:
		message << "List. Single vec" << test_case.m_n_rows;
		break;
	case MATRIX:
		message << "List. Single mat" << test_case.m_n_cols << "x" << test_case.m_n_rows;
		break;
	case MATRIX_ROWS:
		message << "Ctr. Single mat" << test_case.m_n_cols << "x" << test_case.m_n_rows;
		break;
	case STRUCT:
		message << "List. Structure";
		break;
	case NESTED_STRUCT_CTR:
		message << "Ctr. Nested structure";
		break;
	case NESTED_STRUCT_LIST:
		message << "List. Nested structure";
		break;
	case NESTED_STURCT_ARRAYS_STRUCT_LIST:
		message << "List. Structure with structure array";
		break;
	case NESTED_STURCT_ARRAYS_STRUCT_MIX:
		message << "Mix. Structure with structure array";
		break;
	case NESTED_STRUCT_STRUCT_ARRAY_LIST:
		message << "List. Structure with structure with array";
		break;
	case NESTED_STRUCT_STRUCT_ARRAY_MIX:
		message << "Mix. Structure with structure with array";
		break;
	case ARRAY_SCALAR:
		message << "List. Array of scalars";
		break;
	case ARRAY_VECTOR_CTR:
		message << "Ctr. Array of vec" << test_case.m_n_rows;
		break;
	case ARRAY_VECTOR_LIST:
		message << "List. Array of vec" << test_case.m_n_rows;
		break;
	case ARRAY_MATRIX_CTR:
		message << "Ctr. Array of mat" << test_case.m_n_cols << "x" << test_case.m_n_rows;
		break;
	case ARRAY_MATRIX_LIST:
		message << "List. Array of mat" << test_case.m_n_cols << "x" << test_case.m_n_rows;
		break;
	case ARRAY_STRUCT:
		message << "List. Array of structures";
		break;
	case NESTED_ARRAY_STRUCT_STRUCT_LIST:
		message << "List. Array of structures with structures";
		break;
	case NESTED_ARRAY_STRUCT_STRUCT_MIX:
		message << "Mix. Array of structures with structures";
		break;
	case UNSIZED_ARRAY_SCALAR:
		message << "List. Unsized array of scalars";
		break;
	case UNSIZED_ARRAY_VECTOR:
		message << "List. Unsized array of vec" << test_case.m_n_rows;
		break;
	case UNSIZED_ARRAY_MATRIX:
		message << "List. Unsized array of mat" << test_case.m_n_cols << "x" << test_case.m_n_rows;
		break;
	case UNSIZED_ARRAY_STRUCT:
		message << "List. Unsized array of structures";
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	message << tcu::TestLog::EndMessage;
}